

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexHelper.cpp
# Opt level: O0

Var Js::RegexHelper::RegexEs5ReplaceImpl
              (ScriptContext *scriptContext,JavascriptRegExp *regularExpression,
              JavascriptString *input,JavascriptString *replace,bool noResult)

{
  anon_class_24_3_dc2687f5 getGroup_00;
  CharCount replaceLength_00;
  JavascriptString *s;
  JavascriptRegExp *scriptContext_00;
  bool bVar1;
  uint16 uVar2;
  ArenaAllocator *tempAllocator;
  uint *puVar3;
  char16 *pcVar4;
  JavascriptLibrary *this;
  CharCount local_35c;
  char16 *matchedString;
  anon_class_24_3_dc2687f5 getGroup;
  undefined1 local_2d8 [8];
  Builder<256U> concatenated;
  CharCount *pCStack_a8;
  int substitutions;
  CharCount *substitutionOffsets;
  CharCount offset;
  bool isSticky;
  bool isGlobal;
  GroupInfo lastSuccessfulMatch;
  GroupInfo lastActualMatch;
  RegexMatchState state;
  JavascriptString *newString;
  char16 *pcStack_60;
  CharCount inputLength;
  char16 *inputStr;
  char16 *pcStack_50;
  CharCount replaceLength;
  char16 *replaceStr;
  RegexPattern *pattern;
  JavascriptString *pJStack_38;
  bool noResult_local;
  JavascriptString *replace_local;
  JavascriptString *input_local;
  JavascriptRegExp *regularExpression_local;
  ScriptContext *scriptContext_local;
  
  pattern._7_1_ = noResult;
  pJStack_38 = replace;
  replace_local = input;
  input_local = (JavascriptString *)regularExpression;
  regularExpression_local = (JavascriptRegExp *)scriptContext;
  replaceStr = (char16 *)JavascriptRegExp::GetPattern(regularExpression);
  pcStack_50 = JavascriptString::GetString(pJStack_38);
  inputStr._4_4_ = JavascriptString::GetLength(pJStack_38);
  pcStack_60 = JavascriptString::GetString(replace_local);
  newString._4_4_ = JavascriptString::GetLength(replace_local);
  RegexHelperTrace((ScriptContext *)regularExpression_local,Replace,(JavascriptRegExp *)input_local,
                   replace_local,pJStack_38);
  PrimBeginMatch((RegexMatchState *)&lastActualMatch,(ScriptContext *)regularExpression_local,
                 (RegexPattern *)replaceStr,pcStack_60,newString._4_4_,true);
  UnifiedRegex::GroupInfo::GroupInfo(&lastSuccessfulMatch);
  UnifiedRegex::GroupInfo::GroupInfo((GroupInfo *)&offset);
  substitutionOffsets._7_1_ = UnifiedRegex::RegexPattern::IsGlobal((RegexPattern *)replaceStr);
  substitutionOffsets._6_1_ = UnifiedRegex::RegexPattern::IsSticky((RegexPattern *)replaceStr);
  substitutionOffsets._0_4_ = 0;
  if (((substitutionOffsets._7_1_ & 1) == 0) && ((bool)substitutionOffsets._6_1_)) {
    substitutionOffsets._0_4_ = JavascriptRegExp::GetLastIndex((JavascriptRegExp *)input_local);
  }
  pcVar4 = pcStack_50;
  replaceLength_00 = inputStr._4_4_;
  if ((pattern._7_1_ & 1) == 0) {
    pCStack_a8 = (CharCount *)0x0;
    tempAllocator =
         TempArenaAllocatorWrapper<false>::GetAllocator
                   ((TempArenaAllocatorWrapper<false> *)state.input);
    concatenated._548_4_ =
         GetReplaceSubstitutions(pcVar4,replaceLength_00,tempAllocator,&stack0xffffffffffffff58);
    CompoundString::Builder<256U>::Builder
              ((Builder<256U> *)local_2d8,(ScriptContext *)regularExpression_local);
    s = replace_local;
    if ((CharCount)substitutionOffsets != 0) {
      puVar3 = min<unsigned_int>((uint *)&substitutionOffsets,(uint *)((long)&newString + 4));
      CompoundString::Builder<256U>::Append((Builder<256U> *)local_2d8,s,0,*puVar3);
    }
    do {
      if (newString._4_4_ < (CharCount)substitutionOffsets) {
        UnifiedRegex::GroupInfo::Reset(&lastSuccessfulMatch);
        break;
      }
      lastSuccessfulMatch =
           PrimMatch((RegexMatchState *)&lastActualMatch,(ScriptContext *)regularExpression_local,
                     (RegexPattern *)replaceStr,newString._4_4_,(CharCount)substitutionOffsets);
      bVar1 = UnifiedRegex::GroupInfo::IsUndefined(&lastSuccessfulMatch);
      if (bVar1) break;
      _offset = lastSuccessfulMatch;
      CompoundString::Builder<256U>::Append
                ((Builder<256U> *)local_2d8,replace_local,(CharCount)substitutionOffsets,
                 lastSuccessfulMatch.offset - (CharCount)substitutionOffsets);
      scriptContext_00 = regularExpression_local;
      if (pCStack_a8 == (CharCount *)0x0) {
        CompoundString::Builder<256U>::Append((Builder<256U> *)local_2d8,pJStack_38);
      }
      else {
        pcVar4 = pcStack_60 + ((ulong)lastSuccessfulMatch & 0xffffffff);
        uVar2 = UnifiedRegex::RegexPattern::NumGroups((RegexPattern *)replaceStr);
        getGroup_00.pattern._0_4_ = (int)&replaceStr;
        getGroup_00.scriptContext = (ScriptContext **)&regularExpression_local;
        getGroup_00.pattern._4_4_ = (int)((ulong)&replaceStr >> 0x20);
        getGroup_00.input._0_4_ = (int)&replace_local;
        getGroup_00.input._4_4_ = (int)((ulong)&replace_local >> 0x20);
        ReplaceFormatString<Js::RegexHelper::RegexEs5ReplaceImpl(Js::ScriptContext*,Js::JavascriptRegExp*,Js::JavascriptString*,Js::JavascriptString*,bool)::__0>
                  ((ScriptContext *)scriptContext_00,(uint)uVar2,getGroup_00,replace_local,pcVar4,
                   lastSuccessfulMatch,pJStack_38,concatenated._548_4_,pCStack_a8,
                   (Builder<256U> *)local_2d8);
      }
      if (lastSuccessfulMatch.length == 0) {
        if (lastSuccessfulMatch.offset < newString._4_4_) {
          CompoundString::Builder<256U>::Append
                    ((Builder<256U> *)local_2d8,pcStack_60[(ulong)lastSuccessfulMatch & 0xffffffff])
          ;
        }
        substitutionOffsets._0_4_ = lastSuccessfulMatch.offset + 1;
      }
      else {
        substitutionOffsets._0_4_ = UnifiedRegex::GroupInfo::EndOffset(&lastSuccessfulMatch);
      }
    } while ((substitutionOffsets._7_1_ & 1) != 0);
    if ((CharCount)substitutionOffsets == 0) {
      state.matcher = (Matcher *)replace_local;
    }
    else {
      if ((CharCount)substitutionOffsets < newString._4_4_) {
        CompoundString::Builder<256U>::Append
                  ((Builder<256U> *)local_2d8,replace_local,(CharCount)substitutionOffsets,
                   newString._4_4_ - (CharCount)substitutionOffsets);
      }
      state.matcher = (Matcher *)CompoundString::Builder<256U>::ToString((Builder<256U> *)local_2d8)
      ;
    }
    pCStack_a8 = (CharCount *)0x0;
  }
  else {
    do {
      if (newString._4_4_ < (CharCount)substitutionOffsets) {
        UnifiedRegex::GroupInfo::Reset(&lastSuccessfulMatch);
        break;
      }
      lastSuccessfulMatch =
           PrimMatch((RegexMatchState *)&lastActualMatch,(ScriptContext *)regularExpression_local,
                     (RegexPattern *)replaceStr,newString._4_4_,(CharCount)substitutionOffsets);
      bVar1 = UnifiedRegex::GroupInfo::IsUndefined(&lastSuccessfulMatch);
      if (bVar1) break;
      _offset = lastSuccessfulMatch;
      if (lastSuccessfulMatch.length == 0) {
        local_35c = lastSuccessfulMatch.offset + 1;
      }
      else {
        local_35c = UnifiedRegex::GroupInfo::EndOffset(&lastSuccessfulMatch);
      }
      substitutionOffsets._0_4_ = local_35c;
    } while ((substitutionOffsets._7_1_ & 1) != 0);
    this = ScriptContext::GetLibrary((ScriptContext *)regularExpression_local);
    state.matcher = (Matcher *)JavascriptLibrary::GetEmptyString(this);
  }
  PrimEndMatch((RegexMatchState *)&lastActualMatch,(ScriptContext *)regularExpression_local,
               (RegexPattern *)replaceStr);
  PropagateLastMatch((ScriptContext *)regularExpression_local,(bool)(substitutionOffsets._7_1_ & 1),
                     (bool)(substitutionOffsets._6_1_ & 1),(JavascriptRegExp *)input_local,
                     replace_local,_offset,lastSuccessfulMatch,true,true,false);
  return state.matcher;
}

Assistant:

Var RegexHelper::RegexEs5ReplaceImpl(ScriptContext* scriptContext, JavascriptRegExp* regularExpression, JavascriptString* input, JavascriptString* replace, bool noResult)
    {
        UnifiedRegex::RegexPattern* pattern = regularExpression->GetPattern();
        const char16* replaceStr = replace->GetString();
        CharCount replaceLength = replace->GetLength();
        const char16* inputStr = input->GetString();
        CharCount inputLength = input->GetLength();

        JavascriptString* newString = nullptr;

#if ENABLE_REGEX_CONFIG_OPTIONS
        RegexHelperTrace(scriptContext, UnifiedRegex::RegexStats::Replace, regularExpression, input, replace);
#endif

        RegexMatchState state;
        PrimBeginMatch(state, scriptContext, pattern, inputStr, inputLength, true);

        UnifiedRegex::GroupInfo lastActualMatch;
        UnifiedRegex::GroupInfo lastSuccessfulMatch;
        const bool isGlobal = pattern->IsGlobal();
        const bool isSticky = pattern->IsSticky();

        // If global = false and sticky = true, set offset = lastIndex, else set offset = 0
        CharCount offset = 0;
        if (!isGlobal && isSticky)
        {
            offset = regularExpression->GetLastIndex();
        }

        if (!noResult)
        {
            CharCount* substitutionOffsets = nullptr;
            int substitutions = GetReplaceSubstitutions(replaceStr, replaceLength,
                 state.tempAllocatorObj->GetAllocator(), &substitutionOffsets);

            // Use to see if we already have partial result populated in concatenated
            CompoundString::Builder<64 * sizeof(void *) / sizeof(char16)> concatenated(scriptContext);

            // If lastIndex > 0, append input[0..offset] characters to the result
            if (offset > 0)
            {
                concatenated.Append(input, 0, min(offset, inputLength));
            }

            do
            {
                if (offset > inputLength)
                {
                    lastActualMatch.Reset();
                    break;
                }

                lastActualMatch = PrimMatch(state, scriptContext, pattern, inputLength, offset);

                if (lastActualMatch.IsUndefined())
                    break;

                lastSuccessfulMatch = lastActualMatch;
                concatenated.Append(input, offset, lastActualMatch.offset - offset);
                if (substitutionOffsets != 0)
                {
                    auto getGroup = [&](int captureIndex, Var nonMatchValue) {
                        return GetGroup(scriptContext, pattern, input, nonMatchValue, captureIndex);
                    };
                    const char16* matchedString = inputStr + lastActualMatch.offset;
                    ReplaceFormatString(scriptContext, pattern->NumGroups(), getGroup, input, matchedString, lastActualMatch, replace, substitutions, substitutionOffsets, concatenated);
                }
                else
                {
                    concatenated.Append(replace);
                }
                if (lastActualMatch.length == 0)
                {
                    if (lastActualMatch.offset < inputLength)
                    {
                        concatenated.Append(inputStr[lastActualMatch.offset]);
                    }
                    offset = lastActualMatch.offset + 1;
                }
                else
                {
                    offset = lastActualMatch.EndOffset();
                }
            }
            while (isGlobal);

            if (offset == 0)
            {
                // There was no successful match so the result is the input string.
                newString = input;
            }
            else
            {
                if (offset < inputLength)
                {
                    concatenated.Append(input, offset, inputLength - offset);
                }
                newString = concatenated.ToString();
            }
            substitutionOffsets = 0;
        }
        else
        {
            do
            {
                if (offset > inputLength)
                {
                    lastActualMatch.Reset();
                    break;
                }
                lastActualMatch = PrimMatch(state, scriptContext, pattern, inputLength, offset);

                if (lastActualMatch.IsUndefined())
                    break;

                lastSuccessfulMatch = lastActualMatch;
                offset = lastActualMatch.length == 0? lastActualMatch.offset + 1 : lastActualMatch.EndOffset();
            }
            while (isGlobal);
            newString = scriptContext->GetLibrary()->GetEmptyString();
        }

        PrimEndMatch(state, scriptContext, pattern);
        PropagateLastMatch(scriptContext, isGlobal, isSticky, regularExpression, input, lastSuccessfulMatch, lastActualMatch, true, true);
        return newString;
    }